

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O1

void libxml_domnode_binary_insertion_sort_start(xmlNodePtr *dst,size_t start,size_t size)

{
  ulong uVar1;
  xmlNodePtr node2;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  xmlNodePtr pxVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (start < size) {
    uVar9 = start - 2;
    do {
      pxVar10 = dst[start - 1];
      node2 = dst[start];
      iVar4 = xmlXPathCmpNodesExt(pxVar10,node2);
      if (iVar4 < 0 && iVar4 != -2) {
        uVar1 = start - 1;
        iVar4 = xmlXPathCmpNodesExt(node2,*dst);
        uVar3 = uVar9;
        if (iVar4 < 1 && iVar4 != -2) {
          iVar4 = xmlXPathCmpNodesExt(node2,pxVar10);
          uVar6 = uVar1;
          if (iVar4 == -2 || -1 < iVar4) {
            uVar5 = uVar1 >> 1;
            pxVar10 = dst[uVar5];
            uVar7 = 0;
            uVar12 = uVar1;
            do {
              iVar4 = xmlXPathCmpNodesExt(node2,pxVar10);
              if (iVar4 == -2 || 0 < iVar4) {
                uVar8 = uVar7;
                uVar11 = uVar5;
                if (uVar5 - uVar7 < 2) {
                  bVar2 = false;
                  uVar6 = uVar5;
                }
                else {
LAB_001bb3d2:
                  uVar5 = (uVar11 - uVar8 >> 1) + uVar8;
                  pxVar10 = dst[uVar5];
                  bVar2 = true;
                  uVar7 = uVar8;
                  uVar12 = uVar11;
                }
              }
              else {
                uVar8 = uVar5;
                uVar11 = uVar12;
                if (1 < uVar12 - uVar5) goto LAB_001bb3d2;
                uVar6 = uVar5 + 1;
                bVar2 = false;
              }
            } while (bVar2);
          }
        }
        else {
          uVar6 = 0;
        }
        while ((uVar7 = uVar3, uVar6 <= uVar1 &&
               (dst[uVar7 + 2] = dst[uVar7 + 1], uVar7 != 0xffffffffffffffff))) {
          uVar1 = uVar7;
          uVar3 = uVar7 - 1;
        }
        dst[uVar6] = node2;
      }
      start = start + 1;
      uVar9 = uVar9 + 1;
    } while (start != size);
  }
  return;
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start, const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}